

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

void Abc_SclReadSurfaceGenlib(SC_Surface *p)

{
  float *pfVar1;
  uint *puVar2;
  void *pvVar3;
  void **ppvVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  uVar6 = (p->vIndex0).nSize;
  if (uVar6 == (p->vIndex0).nCap) {
    if ((int)uVar6 < 0x10) {
      pfVar1 = (p->vIndex0).pArray;
      if (pfVar1 == (float *)0x0) {
        pfVar1 = (float *)malloc(0x40);
      }
      else {
        pfVar1 = (float *)realloc(pfVar1,0x40);
      }
      (p->vIndex0).pArray = pfVar1;
      (p->vIndex0).nCap = 0x10;
    }
    else {
      pfVar1 = (p->vIndex0).pArray;
      if (pfVar1 == (float *)0x0) {
        pfVar1 = (float *)malloc((ulong)uVar6 << 3);
      }
      else {
        pfVar1 = (float *)realloc(pfVar1,(ulong)uVar6 << 3);
      }
      (p->vIndex0).pArray = pfVar1;
      (p->vIndex0).nCap = uVar6 * 2;
    }
  }
  else {
    pfVar1 = (p->vIndex0).pArray;
  }
  iVar7 = (p->vIndex0).nSize;
  (p->vIndex0).nSize = iVar7 + 1;
  pfVar1[iVar7] = 0.0;
  Vec_IntPush(&p->vIndex0I,0);
  uVar6 = (p->vIndex1).nSize;
  if (uVar6 == (p->vIndex1).nCap) {
    if ((int)uVar6 < 0x10) {
      pfVar1 = (p->vIndex1).pArray;
      if (pfVar1 == (float *)0x0) {
        pfVar1 = (float *)malloc(0x40);
      }
      else {
        pfVar1 = (float *)realloc(pfVar1,0x40);
      }
      (p->vIndex1).pArray = pfVar1;
      (p->vIndex1).nCap = 0x10;
    }
    else {
      pfVar1 = (p->vIndex1).pArray;
      if (pfVar1 == (float *)0x0) {
        pfVar1 = (float *)malloc((ulong)uVar6 << 3);
      }
      else {
        pfVar1 = (float *)realloc(pfVar1,(ulong)uVar6 << 3);
      }
      (p->vIndex1).pArray = pfVar1;
      (p->vIndex1).nCap = uVar6 * 2;
    }
  }
  else {
    pfVar1 = (p->vIndex1).pArray;
  }
  iVar7 = (p->vIndex1).nSize;
  (p->vIndex1).nSize = iVar7 + 1;
  pfVar1[iVar7] = 0.0;
  iVar7 = 0;
  Vec_IntPush(&p->vIndex1I,0);
  if (0 < (p->vIndex0).nSize) {
    uVar6 = (p->vIndex1).nSize;
    do {
      puVar2 = (uint *)malloc(0x10);
      if (uVar6 - 1 < 0xf) {
        uVar6 = 0x10;
      }
      puVar2[1] = 0;
      *puVar2 = uVar6;
      if (uVar6 == 0) {
        pvVar3 = (void *)0x0;
      }
      else {
        pvVar3 = malloc((long)(int)uVar6 << 2);
      }
      *(void **)(puVar2 + 2) = pvVar3;
      uVar6 = (p->vData).nSize;
      if (uVar6 == (p->vData).nCap) {
        if ((int)uVar6 < 0x10) {
          ppvVar4 = (p->vData).pArray;
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          (p->vData).pArray = ppvVar4;
          (p->vData).nCap = 0x10;
        }
        else {
          ppvVar4 = (p->vData).pArray;
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar6 << 4);
          }
          (p->vData).pArray = ppvVar4;
          (p->vData).nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar4 = (p->vData).pArray;
      }
      iVar8 = (p->vData).nSize;
      (p->vData).nSize = iVar8 + 1;
      ppvVar4[iVar8] = puVar2;
      iVar8 = (p->vIndex1).nSize;
      p_00 = (Vec_Int_t *)malloc(0x10);
      if (iVar8 - 1U < 0xf) {
        iVar8 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar8;
      if (iVar8 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc((long)iVar8 << 2);
      }
      p_00->pArray = piVar5;
      uVar6 = (p->vDataI).nSize;
      if (uVar6 == (p->vDataI).nCap) {
        if ((int)uVar6 < 0x10) {
          ppvVar4 = (p->vDataI).pArray;
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          (p->vDataI).pArray = ppvVar4;
          (p->vDataI).nCap = 0x10;
        }
        else {
          ppvVar4 = (p->vDataI).pArray;
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar6 << 4);
          }
          (p->vDataI).pArray = ppvVar4;
          (p->vDataI).nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar4 = (p->vDataI).pArray;
      }
      iVar8 = (p->vDataI).nSize;
      (p->vDataI).nSize = iVar8 + 1;
      ppvVar4[iVar8] = p_00;
      uVar6 = (p->vIndex1).nSize;
      if (0 < (int)uVar6) {
        iVar8 = 0;
        do {
          uVar6 = puVar2[1];
          if (uVar6 == *puVar2) {
            if ((int)uVar6 < 0x10) {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar3 = malloc(0x40);
              }
              else {
                pvVar3 = realloc(*(void **)(puVar2 + 2),0x40);
              }
              *(void **)(puVar2 + 2) = pvVar3;
              *puVar2 = 0x10;
            }
            else {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar3 = malloc((ulong)uVar6 * 8);
              }
              else {
                pvVar3 = realloc(*(void **)(puVar2 + 2),(ulong)uVar6 * 8);
              }
              *(void **)(puVar2 + 2) = pvVar3;
              *puVar2 = uVar6 * 2;
            }
          }
          else {
            pvVar3 = *(void **)(puVar2 + 2);
          }
          uVar6 = puVar2[1];
          puVar2[1] = uVar6 + 1;
          *(undefined4 *)((long)pvVar3 + (long)(int)uVar6 * 4) = 0x3f800000;
          Vec_IntPush(p_00,1000);
          iVar8 = iVar8 + 1;
          uVar6 = (p->vIndex1).nSize;
        } while (iVar8 < (int)uVar6);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (p->vIndex0).nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reading library from file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Abc_SclReadSurfaceGenlib( SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    Vec_FltPush( &p->vIndex0, 0 );
    Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(0) );

    Vec_FltPush( &p->vIndex1, 0 );
    Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(0) );

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            Vec_FltPush( vVec, 1 );
            Vec_IntPush( vVecI, Scl_Flt2Int(1) );
        }
    }
}